

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O0

bool __thiscall directed_graph_t::add_edge(directed_graph_t *this,vertex_index_t v,vertex_index_t w)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  reference pvVar2;
  uint uVar3;
  uint uVar4;
  ushort in_DX;
  ulong uVar5;
  ushort in_SI;
  ushort *in_RDI;
  size_t ww;
  size_t vv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  value_type_conflict4 *in_stack_fffffffffffffee8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff2c;
  string local_38 [28];
  vertex_index_t in_stack_ffffffffffffffe4;
  vertex_index_t in_stack_ffffffffffffffe6;
  undefined4 in_stack_ffffffffffffffe8;
  bool local_1;
  
  if (((in_RDI[0x34] & 1) == 0) && (in_DX < in_SI)) {
    local_1 = add_edge((directed_graph_t *)CONCAT26(in_SI,CONCAT24(in_DX,in_stack_ffffffffffffffe8))
                       ,in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe4);
  }
  else {
    if ((*in_RDI <= in_SI) || (*in_RDI <= in_DX)) {
      uVar6 = 1;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::max<unsigned_short>
                ((unsigned_short *)&stack0xffffffffffffffee,
                 (unsigned_short *)&stack0xffffffffffffffec);
      std::__cxx11::to_string(in_stack_ffffffffffffff2c);
      std::operator+((char *)__lhs,in_stack_fffffffffffffee0);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffee0);
      std::__cxx11::to_string(in_stack_ffffffffffffff2c);
      std::operator+(in_stack_ffffffffffffff18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar6,in_stack_ffffffffffffff10));
      std::operator+(__lhs,(char *)in_stack_fffffffffffffee0);
      std::logic_error::logic_error((logic_error *)__lhs,local_38);
      __cxa_throw(__lhs,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    uVar3 = (uint)in_SI;
    uVar4 = (uint)in_DX;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x44),
                        (ulong)in_SI * *(long *)(in_RDI + 0x50) + (long)((int)uVar4 >> 6));
    if ((*pvVar2 & 1L << ((byte)in_DX & 0x3f)) == 0) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x1c),
                          (ulong)in_SI);
      *pvVar2 = *pvVar2 + 1;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x28),
                          (ulong)in_DX);
      *pvVar2 = *pvVar2 + 1;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      bVar1 = (byte)in_DX;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x44),
                          (ulong)in_SI * *(long *)(in_RDI + 0x50) + (long)((int)uVar4 >> 6));
      *pvVar2 = 1L << (bVar1 & 0x3f) | *pvVar2;
      uVar5 = 1L << ((byte)in_SI & 0x3f);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x38),
                          (ulong)in_DX * *(long *)(in_RDI + 0x50) + (long)((int)uVar3 >> 6));
      *pvVar2 = uVar5 | *pvVar2;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool add_edge(vertex_index_t v, vertex_index_t w) {
		if (!directed && v > w) return add_edge(w, v);

		if (v >= number_of_vertices || w >= number_of_vertices)
			throw std::logic_error("Out of bounds, tried to add an edge involving vertex " +
			                       std::to_string(std::max(v, w)) + ", but there are only " +
			                       std::to_string(number_of_vertices) + " vertices.");

		const size_t vv = v >> 6;
		const size_t ww = w >> 6;

		// Prevent multiple insertions
		if (incidence_outgoing[v * incidence_row_length + ww] & (ONE_ << ((w - (ww << 6))))) return false;

		outdegrees[v]++;
		indegrees[w]++;
		edges.push_back(v);
		edges.push_back(w);

		incidence_outgoing[v * incidence_row_length + ww] |= ONE_ << ((w - (ww << 6)));

		incidence_incoming[w * incidence_row_length + vv] |= ONE_ << (v - (vv << 6));
		return true;
	}